

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  int code;
  size_t sVar1;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  uchar *puVar4;
  iovec *piVar5;
  void *pvVar6;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  bool bVar7;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> AVar8;
  ArrayPtr<iovec> AVar9;
  Fault local_1d8;
  Fault f_1;
  Fault f;
  SyscallResult local_1a4;
  undefined1 auStack_1a0 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  iovec *current;
  uint i;
  undefined1 local_180 [8];
  ArrayPtr<iovec> iov;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  bool iov_isOnStack;
  size_t iov_size;
  ArrayPtr<const_unsigned_char> *local_40;
  ArrayPtr<const_unsigned_char> *local_38;
  size_t local_30;
  size_t iovmax;
  FdOutputStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  this_local = (FdOutputStream *)CONCAT44(in_register_00000034,__fd);
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__buf;
  sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  sVar1 = miniposix::iovMax(sVar1);
  while (sVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                           ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local),
        sVar1 < sVar2) {
    AVar8 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0,sVar1);
    local_38 = AVar8.ptr;
    local_30 = AVar8.size_;
    (*(this->super_OutputStream)._vptr_OutputStream[3])(this,local_38,local_30);
    sVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    AVar8 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,sVar1,sVar2
                      );
    iov_size = (size_t)AVar8.ptr;
    this_local = (FdOutputStream *)iov_size;
    local_40 = (ArrayPtr<const_unsigned_char> *)AVar8.size_;
    pieces_local.ptr = local_40;
  }
  sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  if (sVar1 < 0x11) {
    Array<iovec>::Array((Array<iovec> *)&iov.size_,(void *)0x0);
    AVar9 = arrayPtr<iovec>((iovec *)&iov_heap.disposer,sVar1);
  }
  else {
    heapArray<iovec>((Array<iovec> *)&iov.size_,sVar1);
    AVar9 = kj::Array::operator_cast_to_ArrayPtr((Array *)&iov.size_);
  }
  current._0_4_ = 0;
  while( true ) {
    iov.ptr = (iovec *)AVar9.size_;
    local_180 = (undefined1  [8])AVar9.ptr;
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    if (sVar1 <= (uint)current) break;
    pAVar3 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,
                        (ulong)(uint)current);
    puVar4 = ArrayPtr<const_unsigned_char>::begin(pAVar3);
    piVar5 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_180,(ulong)(uint)current);
    piVar5->iov_base = puVar4;
    pAVar3 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,
                        (ulong)(uint)current);
    sVar1 = ArrayPtr<const_unsigned_char>::size(pAVar3);
    piVar5 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_180,(ulong)(uint)current);
    AVar9.size_ = (size_t)iov.ptr;
    AVar9.ptr = (iovec *)local_180;
    piVar5->iov_len = sVar1;
    current._0_4_ = (uint)current + 1;
  }
  n = (ssize_t)ArrayPtr<iovec>::begin((ArrayPtr<iovec> *)local_180);
  while( true ) {
    piVar5 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)local_180);
    bVar7 = false;
    if ((ulong)n < piVar5) {
      bVar7 = *(long *)(n + 8) == 0;
    }
    if (!bVar7) break;
    n = n + 0x10;
  }
  while( true ) {
    piVar5 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)local_180);
    if (piVar5 <= (ulong)n) {
      Array<iovec>::~Array((Array<iovec> *)&iov.size_);
      return extraout_RAX;
    }
    _auStack_1a0 = (char *)0x0;
    f.exception = (Exception *)auStack_1a0;
    local_1a4 = _::Debug::
                syscall<kj::FdOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::__0>
                          ((anon_class_32_4_9105ee26 *)&f,false);
    pvVar6 = _::Debug::SyscallResult::operator_cast_to_void_(&local_1a4);
    if (pvVar6 == (void *)0x0) break;
    if ((long)_auStack_1a0 < 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&local_1d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x197,FAILED,"n > 0","\"writev() returned zero.\"",
                 (char (*) [24])"writev() returned zero.");
      _::Debug::Fault::fatal(&local_1d8);
    }
    while( true ) {
      piVar5 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)local_180);
      bVar7 = false;
      if ((ulong)n < piVar5) {
        bVar7 = *(char **)(n + 8) <= _auStack_1a0;
      }
      if (!bVar7) break;
      _auStack_1a0 = _auStack_1a0 + -*(long *)(n + 8);
      n = n + 0x10;
    }
    if (0 < (long)_auStack_1a0) {
      *(char **)n = _auStack_1a0 + *(long *)n;
      *(long *)(n + 8) = *(long *)(n + 8) - (long)_auStack_1a0;
    }
  }
  code = _::Debug::SyscallResult::getErrorNumber(&local_1a4);
  _::Debug::Fault::Fault<int,int&>
            (&f_1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
             ,0x196,code,"n = ::writev(fd, current, iov.end() - current)","fd",&this->fd);
  _::Debug::Fault::fatal(&f_1);
}

Assistant:

void FdOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
#if _WIN32
  // Windows has no reasonable writev(). It has WriteFileGather, but this call has the unreasonable
  // restriction that each segment must be page-aligned. So, fall back to the default implementation

  OutputStream::write(pieces);

#else
  const size_t iovmax = miniposix::iovMax(pieces.size());
  while (pieces.size() > iovmax) {
    write(pieces.slice(0, iovmax));
    pieces = pieces.slice(iovmax, pieces.size());
  }

  KJ_STACK_ARRAY(struct iovec, iov, pieces.size(), 16, 128);

  for (uint i = 0; i < pieces.size(); i++) {
    // writev() interface is not const-correct.  :(
    iov[i].iov_base = const_cast<byte*>(pieces[i].begin());
    iov[i].iov_len = pieces[i].size();
  }

  struct iovec* current = iov.begin();

  // Advance past any leading empty buffers so that a write full of only empty buffers does not
  // cause a syscall at all.
  while (current < iov.end() && current->iov_len == 0) {
    ++current;
  }

  while (current < iov.end()) {
    // Issue the write.
    ssize_t n = 0;
    KJ_SYSCALL(n = ::writev(fd, current, iov.end() - current), fd);
    KJ_ASSERT(n > 0, "writev() returned zero.");

    // Advance past all buffers that were fully-written.
    while (current < iov.end() && static_cast<size_t>(n) >= current->iov_len) {
      n -= current->iov_len;
      ++current;
    }

    // If we only partially-wrote one of the buffers, adjust the pointer and size to include only
    // the unwritten part.
    if (n > 0) {
      current->iov_base = reinterpret_cast<byte*>(current->iov_base) + n;
      current->iov_len -= n;
    }
  }
#endif
}